

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O0

string * nivalis::nivalis_to_latex_safe(string *expr_in)

{
  initializer_list<char> __l;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_00;
  initializer_list<char> __l_01;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_02;
  initializer_list<char> __l_03;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_04;
  string_view to;
  string_view to_00;
  string_view to_01;
  string_view to_02;
  string_view to_03;
  string_view to_04;
  string_view to_05;
  string_view to_06;
  string_view to_07;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  string_view src_03;
  string_view src_04;
  string_view src_05;
  string_view src_06;
  string_view src_07;
  ulong uVar1;
  char *pcVar2;
  string *in_RSI;
  string *in_RDI;
  long *in_FS_OFFSET;
  string expr;
  int in_stack_fffffffffffff74c;
  ParenRuleOutputItem *in_stack_fffffffffffff750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff758;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff760;
  allocator_type *in_stack_fffffffffffff778;
  ParenRuleOutputItem *in_stack_fffffffffffff780;
  iterator in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  undefined1 **local_820;
  undefined1 **local_7f0;
  string *in_stack_fffffffffffff828;
  size_t in_stack_fffffffffffff830;
  char *in_stack_fffffffffffff838;
  string *psVar3;
  string *in_stack_fffffffffffff840;
  ParenRule *in_stack_fffffffffffff848;
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [37];
  undefined1 local_643;
  undefined1 local_642;
  undefined8 *local_640;
  undefined1 *local_638 [5];
  undefined1 local_610 [40];
  undefined1 local_5e8 [40];
  undefined8 *local_5c0;
  undefined8 local_5b8;
  allocator<char> local_5aa;
  undefined1 local_5a9;
  undefined1 *local_5a8;
  undefined8 local_5a0;
  allocator<char> local_594;
  undefined1 local_593;
  undefined1 local_592;
  undefined8 *local_590;
  undefined1 *local_588 [5];
  undefined1 local_560 [40];
  undefined1 local_538 [40];
  undefined8 *local_510;
  undefined8 local_508;
  allocator<char> local_4fa;
  undefined1 local_4f9;
  undefined1 *local_4f8;
  undefined8 local_4f0;
  allocator<char> local_4e4;
  undefined1 local_4e3;
  undefined1 local_4e2;
  undefined1 local_4e1 [9];
  string local_4d8;
  undefined1 local_4b0 [40];
  undefined1 local_488 [40];
  string *local_460;
  size_type local_458;
  allocator<char> local_44a;
  undefined1 local_449 [9];
  undefined8 local_440;
  allocator<char> local_431 [24];
  allocator<char> local_419;
  string local_418 [32];
  undefined1 local_3f8 [16];
  string local_3e8 [55];
  allocator<char> local_3b1;
  string local_3b0 [32];
  undefined1 local_390 [16];
  string local_380 [55];
  allocator<char> local_349;
  string local_348 [32];
  undefined1 local_328 [16];
  string local_318 [55];
  allocator<char> local_2e1;
  string local_2e0 [32];
  undefined1 local_2c0 [16];
  string local_2b0 [55];
  allocator<char> local_279;
  string local_278 [32];
  undefined1 local_258 [16];
  string local_248 [55];
  allocator<char> local_211;
  string local_210 [32];
  undefined1 local_1f0 [16];
  string local_1e0 [55];
  allocator<char> local_1a9;
  string local_1a8 [32];
  undefined1 local_188 [16];
  string local_178 [55];
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [16];
  string local_110 [55];
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [16];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [36];
  undefined4 local_44;
  allocator<char> local_3d [13];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  util::trim((string *)0x27f254);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    if (*pcVar2 == '#') {
      std::__cxx11::string::substr((ulong)local_88,(ulong)local_30);
      std::operator+((char *)in_stack_fffffffffffff758,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff750);
      std::operator+(in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
    }
    else {
      local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src._M_str = (char *)in_stack_fffffffffffff848;
      src._M_len = (size_t)in_stack_fffffffffffff840;
      to._M_str = in_stack_fffffffffffff838;
      to._M_len = in_stack_fffffffffffff830;
      util::str_replace(src,in_stack_fffffffffffff828,to);
      std::__cxx11::string::operator=(local_30,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      local_120 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_00._M_str = (char *)in_stack_fffffffffffff848;
      src_00._M_len = (size_t)in_stack_fffffffffffff840;
      to_00._M_str = in_stack_fffffffffffff838;
      to_00._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_00,in_stack_fffffffffffff828,to_00);
      std::__cxx11::string::operator=(local_30,local_110);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
      local_188 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_01._M_str = (char *)in_stack_fffffffffffff848;
      src_01._M_len = (size_t)in_stack_fffffffffffff840;
      to_01._M_str = in_stack_fffffffffffff838;
      to_01._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_01,in_stack_fffffffffffff828,to_01);
      std::__cxx11::string::operator=(local_30,local_178);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_02._M_str = (char *)in_stack_fffffffffffff848;
      src_02._M_len = (size_t)in_stack_fffffffffffff840;
      to_02._M_str = in_stack_fffffffffffff838;
      to_02._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_02,in_stack_fffffffffffff828,to_02);
      std::__cxx11::string::operator=(local_30,local_1e0);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
      local_258 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_03._M_str = (char *)in_stack_fffffffffffff848;
      src_03._M_len = (size_t)in_stack_fffffffffffff840;
      to_03._M_str = in_stack_fffffffffffff838;
      to_03._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_03,in_stack_fffffffffffff828,to_03);
      std::__cxx11::string::operator=(local_30,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator(&local_279);
      local_2c0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_04._M_str = (char *)in_stack_fffffffffffff848;
      src_04._M_len = (size_t)in_stack_fffffffffffff840;
      to_04._M_str = in_stack_fffffffffffff838;
      to_04._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_04,in_stack_fffffffffffff828,to_04);
      std::__cxx11::string::operator=(local_30,local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
      local_328 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_05._M_str = (char *)in_stack_fffffffffffff848;
      src_05._M_len = (size_t)in_stack_fffffffffffff840;
      to_05._M_str = in_stack_fffffffffffff838;
      to_05._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_05,in_stack_fffffffffffff828,to_05);
      std::__cxx11::string::operator=(local_30,local_318);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_348);
      std::allocator<char>::~allocator(&local_349);
      local_390 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_06._M_str = (char *)in_stack_fffffffffffff848;
      src_06._M_len = (size_t)in_stack_fffffffffffff840;
      to_06._M_str = in_stack_fffffffffffff838;
      to_06._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_06,in_stack_fffffffffffff828,to_06);
      std::__cxx11::string::operator=(local_30,local_380);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      local_3f8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                 (allocator<char> *)in_stack_fffffffffffff780);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
      src_07._M_str = (char *)in_stack_fffffffffffff848;
      src_07._M_len = (size_t)in_stack_fffffffffffff840;
      to_07._M_str = in_stack_fffffffffffff838;
      to_07._M_len = in_stack_fffffffffffff830;
      util::str_replace(src_07,in_stack_fffffffffffff828,to_07);
      std::__cxx11::string::operator=(local_30,local_3e8);
      std::__cxx11::string::~string(local_3e8);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator(&local_419);
      if ((char)in_FS_OFFSET[-0x2c] == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                   (allocator<char> *)in_stack_fffffffffffff780);
        local_4e3 = 1;
        local_449[0] = '(';
        local_449._1_8_ = local_449;
        local_440 = 1;
        std::allocator<char>::allocator();
        __l._M_len = (size_type)in_stack_fffffffffffff790;
        __l._M_array = (iterator)in_stack_fffffffffffff788;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff780,__l,
                   (allocator_type *)in_stack_fffffffffffff778);
        local_4e2 = 1;
        local_4e1._1_8_ = &local_4d8;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
        local_4e1._1_8_ = local_4b0;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
        local_4e1._1_8_ = local_488;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
        local_460 = &local_4d8;
        local_458 = 3;
        in_stack_fffffffffffff848 = (ParenRule *)local_4e1;
        std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
                  ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)
                   0x27fd5c);
        __l_00._M_len = (size_type)in_stack_fffffffffffff790;
        __l_00._M_array = in_stack_fffffffffffff788;
        std::
        vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
        ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                  *)in_stack_fffffffffffff780,__l_00,in_stack_fffffffffffff778);
        local_4e2 = 0;
        local_4e3 = 0;
        std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
                  ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)
                   0x27fda8);
        psVar3 = &local_4d8;
        in_stack_fffffffffffff840 = (string *)&local_460;
        do {
          in_stack_fffffffffffff840 = (string *)((long)&in_stack_fffffffffffff840[-2].field_2 + 8);
          anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                    ((ParenRuleOutputItem *)0x27fddd);
        } while (in_stack_fffffffffffff840 != psVar3);
        std::allocator<char>::~allocator(&local_44a);
        std::allocator<char>::~allocator(local_431);
        __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x1b0,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -0x2c) = 1;
      }
      if ((char)in_FS_OFFSET[-0x21] == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                   (allocator<char> *)in_stack_fffffffffffff780);
        local_593 = 1;
        local_4f9 = 0x28;
        local_4f8 = &local_4f9;
        local_4f0 = 1;
        std::allocator<char>::allocator();
        __l_01._M_len = (size_type)in_stack_fffffffffffff790;
        __l_01._M_array = (iterator)in_stack_fffffffffffff788;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff780,__l_01,
                   (allocator_type *)in_stack_fffffffffffff778);
        local_592 = 1;
        local_590 = local_588;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
        local_590 = (undefined8 *)local_560;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
        local_590 = (undefined8 *)local_538;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
        local_510 = local_588;
        local_508 = 3;
        std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
                  ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)
                   0x27ff89);
        __l_02._M_len = (size_type)in_stack_fffffffffffff790;
        __l_02._M_array = in_stack_fffffffffffff788;
        std::
        vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
        ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                  *)in_stack_fffffffffffff780,__l_02,in_stack_fffffffffffff778);
        local_592 = 0;
        local_593 = 0;
        std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
                  ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)
                   0x27ffd5);
        local_7f0 = (undefined1 **)&local_510;
        do {
          local_7f0 = local_7f0 + -5;
          anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                    ((ParenRuleOutputItem *)0x28000a);
        } while (local_7f0 != local_588);
        std::allocator<char>::~allocator(&local_4fa);
        std::allocator<char>::~allocator(&local_4e4);
        __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x158,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -0x21) = 1;
      }
      if ((char)in_FS_OFFSET[-0x16] == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                   (allocator<char> *)in_stack_fffffffffffff780);
        local_643 = 1;
        local_5a9 = 0x28;
        local_5a8 = &local_5a9;
        local_5a0 = 1;
        std::allocator<char>::allocator();
        __l_03._M_len = (size_type)in_stack_fffffffffffff790;
        __l_03._M_array = (iterator)in_stack_fffffffffffff788;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff780,__l_03,
                   (allocator_type *)in_stack_fffffffffffff778);
        local_642 = 1;
        local_640 = local_638;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
        local_640 = (undefined8 *)local_610;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
        local_640 = (undefined8 *)local_5e8;
        anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
                  (in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
        local_5c0 = local_638;
        local_5b8 = 3;
        std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
                  ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)
                   0x2801b6);
        __l_04._M_len = (size_type)in_stack_fffffffffffff790;
        __l_04._M_array = in_stack_fffffffffffff788;
        std::
        vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
        ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                  *)in_stack_fffffffffffff780,__l_04,in_stack_fffffffffffff778);
        local_642 = 0;
        local_643 = 0;
        std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
                  ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)
                   0x280202);
        local_820 = (undefined1 **)&local_5c0;
        do {
          local_820 = local_820 + -5;
          anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                    ((ParenRuleOutputItem *)0x280237);
        } while (local_820 != local_638);
        std::allocator<char>::~allocator(&local_5aa);
        std::allocator<char>::~allocator(&local_594);
        __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x100,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -0x16) = 1;
      }
      anon_unknown_1::ParenRule::operator()(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      anon_unknown_1::ParenRule::operator()(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      anon_unknown_1::ParenRule::operator()(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      std::__cxx11::string::operator=(local_30,local_668);
      std::__cxx11::string::~string(local_668);
      std::__cxx11::string::~string(local_688);
      std::__cxx11::string::~string(local_6a8);
      std::__cxx11::string::string((string *)in_RDI,local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
               (allocator<char> *)in_stack_fffffffffffff780);
    std::allocator<char>::~allocator(local_3d);
  }
  local_44 = 1;
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string nivalis_to_latex_safe(const std::string& expr_in) {
    std::string expr = expr_in;
    util::trim(expr);
    if (expr.empty()) return "";
    if (expr[0] == '#') return "\\text{" + expr.substr(1) + "}";
    expr = util::str_replace(expr, "*", "\\cdot ");
    expr = util::str_replace(expr, "<=", "\\le ");
    expr = util::str_replace(expr, ">=", "\\ge ");
    expr = util::str_replace(expr, "!=", "\\ne ");
    expr = util::str_replace(expr, "&", "\\wedge ");
    expr = util::str_replace(expr, "|", "\\vee ");
    expr = util::str_replace(expr, "{", "\\left\\{");
    expr = util::str_replace(expr, "}", "\\right\\}");
    expr = util::str_replace(expr, "@", "\\operatorname{at} ");

    thread_local ParenRule
        n2l_sqrt { "sqrt", {'('}, {"\\sqrt{", 0, "}"} },
        n2l_abs { "abs", {'('}, {"\\left|", 0, "\\right|"} },
        n2l_diff { "diff", {'('}, {"\\frac{d}{d", 0, "}"} };
    expr = n2l_diff(n2l_abs(n2l_sqrt(expr)));
    return expr;
}